

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnFuncType
          (BinaryReaderObjdump *this,Index index,Index param_count,Type *param_types,
          Index result_count,Type *result_types)

{
  bool bVar1;
  string local_a8;
  uint local_84;
  undefined1 local_80 [4];
  Index i_1;
  string local_60;
  uint local_3c;
  Type *pTStack_38;
  Index i;
  Type *result_types_local;
  Type *pTStack_28;
  Index result_count_local;
  Type *param_types_local;
  Index param_count_local;
  Index index_local;
  BinaryReaderObjdump *this_local;
  
  pTStack_38 = result_types;
  result_types_local._4_4_ = result_count;
  pTStack_28 = param_types;
  param_types_local._0_4_ = param_count;
  param_types_local._4_4_ = index;
  _param_count_local = this;
  bVar1 = ShouldPrintDetails(this);
  if (bVar1) {
    printf(" - type[%u] (");
    for (local_3c = 0; local_3c < (Index)param_types_local; local_3c = local_3c + 1) {
      if (local_3c != 0) {
        printf(", ");
      }
      Type::GetName_abi_cxx11_(&local_60,pTStack_28 + local_3c);
      std::__cxx11::string::c_str();
      printf("%s");
      std::__cxx11::string::~string((string *)&local_60);
    }
    printf(") -> ");
    if (result_types_local._4_4_ == 0) {
      printf("nil");
    }
    else if (result_types_local._4_4_ == 1) {
      Type::GetName_abi_cxx11_((string *)local_80,pTStack_38);
      std::__cxx11::string::c_str();
      printf("%s");
      std::__cxx11::string::~string((string *)local_80);
    }
    else {
      printf("(");
      for (local_84 = 0; local_84 < result_types_local._4_4_; local_84 = local_84 + 1) {
        if (local_84 != 0) {
          printf(", ");
        }
        Type::GetName_abi_cxx11_(&local_a8,pTStack_38 + local_84);
        std::__cxx11::string::c_str();
        printf("%s");
        std::__cxx11::string::~string((string *)&local_a8);
      }
      printf(")");
    }
    printf("\n");
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdump::OnFuncType(Index index,
                                       Index param_count,
                                       Type* param_types,
                                       Index result_count,
                                       Type* result_types) {
  if (!ShouldPrintDetails()) {
    return Result::Ok;
  }
  printf(" - type[%" PRIindex "] (", index);
  for (Index i = 0; i < param_count; i++) {
    if (i != 0) {
      printf(", ");
    }
    printf("%s", param_types[i].GetName().c_str());
  }
  printf(") -> ");
  switch (result_count) {
    case 0:
      printf("nil");
      break;
    case 1:
      printf("%s", result_types[0].GetName().c_str());
      break;
    default:
      printf("(");
      for (Index i = 0; i < result_count; i++) {
        if (i != 0) {
          printf(", ");
        }
        printf("%s", result_types[i].GetName().c_str());
      }
      printf(")");
      break;
  }
  printf("\n");
  return Result::Ok;
}